

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_growth_policy.h
# Opt level: O3

void __thiscall
tsl::rh::prime_growth_policy::prime_growth_policy
          (prime_growth_policy *this,size_t *min_bucket_count_in_out)

{
  undefined1 *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = *min_bucket_count_in_out;
  uVar3 = 0x33;
  puVar1 = detail::PRIMES;
  do {
    uVar4 = uVar3 >> 1;
    uVar5 = ~uVar4 + uVar3;
    uVar3 = uVar4;
    if (*(ulong *)((long)puVar1 + uVar4 * 8) < uVar2) {
      puVar1 = (undefined1 *)((ulong *)((long)puVar1 + uVar4 * 8) + 1);
      uVar3 = uVar5;
    }
  } while (0 < (long)uVar3);
  if (puVar1 != &DAT_00121878) {
    this->m_iprime = (uint)((ulong)((long)puVar1 + -0x1216e0) >> 3);
    if (uVar2 == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ulong *)puVar1;
    }
    *min_bucket_count_in_out = uVar2;
    return;
  }
  std::terminate();
}

Assistant:

explicit prime_growth_policy(std::size_t& min_bucket_count_in_out) {
    auto it_prime = std::lower_bound(
        detail::PRIMES.begin(), detail::PRIMES.end(), min_bucket_count_in_out);
    if (it_prime == detail::PRIMES.end()) {
      TSL_RH_THROW_OR_TERMINATE(std::length_error,
                                "The hash table exceeds its maximum size.");
    }

    m_iprime = static_cast<unsigned int>(
        std::distance(detail::PRIMES.begin(), it_prime));
    if (min_bucket_count_in_out > 0) {
      min_bucket_count_in_out = *it_prime;
    } else {
      min_bucket_count_in_out = 0;
    }
  }